

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternAddressMapper.cpp
# Opt level: O1

vector<volatile_char_*,_std::allocator<volatile_char_*>_> * __thiscall
PatternAddressMapper::get_random_nonaccessed_rows
          (vector<volatile_char_*,_std::allocator<volatile_char_*>_> *__return_storage_ptr__,
          PatternAddressMapper *this,int row_upper_bound)

{
  int iVar1;
  int iVar2;
  char *local_58;
  DRAMAddr local_50;
  vector<char_volatile*,std::allocator<char_volatile*>> *local_38;
  
  (__return_storage_ptr__->super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = 0x400;
  local_38 = (vector<char_volatile*,std::allocator<char_volatile*>> *)__return_storage_ptr__;
  do {
    local_50.bank._0_4_ = (int)this->max_row;
    local_50.bank._4_4_ = (int)this->min_row + (int)local_50.bank;
    local_50.row._0_4_ = 1;
    local_50.row._4_4_ = (int)local_50.bank;
    local_50.col._0_4_ = local_50.bank._4_4_;
    iVar1 = Range<int>::get_random_number((Range<int> *)&local_50,&this->gen);
    DRAMAddr::DRAMAddr(&local_50,(long)this->bank_no,(long)(iVar1 % row_upper_bound),0);
    local_58 = (char *)DRAMAddr::to_virt(&local_50);
    std::vector<char_volatile*,std::allocator<char_volatile*>>::emplace_back<char_volatile*>
              (local_38,&local_58);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return (vector<volatile_char_*,_std::allocator<volatile_char_*>_> *)local_38;
}

Assistant:

std::vector<volatile char *> PatternAddressMapper::get_random_nonaccessed_rows(int row_upper_bound) {
  // we don't mind if addresses are added multiple times
  std::vector<volatile char *> addresses;
  for (int i = 0; i < 1024; ++i) {
    auto row_no = Range<int>(max_row, max_row + min_row).get_random_number(gen)%row_upper_bound;
    addresses.push_back(
        static_cast<volatile char*>(DRAMAddr(static_cast<size_t>(bank_no), static_cast<size_t>(row_no), 0).to_virt()));
  }
  return addresses;
}